

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.cc
# Opt level: O1

AttrValue *
bloaty::dwarf::AttrValue::ParseAttr
          (AttrValue *__return_storage_ptr__,CU *cu,uint16_t form,string_view *data)

{
  uint uVar1;
  uint64_t uVar2;
  size_t sVar3;
  Nonnull<char_*> pcVar4;
  char *pcVar5;
  ulong uVar6;
  Arg *in_R8;
  string_view format;
  string_view sVar7;
  string local_78;
  long local_58;
  Nonnull<char_*> local_50;
  char local_48 [32];
  
LAB_001a62a0:
  switch(form) {
  case 1:
    goto switchD_001a62b2_caseD_1;
  case 2:
  case 0x1c:
  case 0x1d:
  case 0x24:
switchD_001a62b2_caseD_2:
    pcVar4 = absl::numbers_internal::FastIntToBuffer((uint)form,local_48);
    local_58 = (long)pcVar4 - (long)local_48;
    format._M_str = (char *)&local_58;
    format._M_len = (size_t)"Don\'t know how to parse DWARF form: $0";
    local_50 = local_48;
    absl::Substitute_abi_cxx11_(&local_78,(absl *)0x26,format,in_R8);
    Throw(local_78._M_dataplus._M_p,0xf0);
  case 3:
    sVar7 = ReadBlock<unsigned_short>(data);
    break;
  case 4:
    sVar7 = ReadBlock<unsigned_int>(data);
    break;
  case 5:
    if (data->_M_len < 2) {
LAB_001a66e8:
      Throw("premature EOF reading variable-length DWARF data",0xad);
    }
    pcVar5 = data->_M_str;
    data->_M_str = pcVar5 + 2;
    data->_M_len = data->_M_len - 2;
    (__return_storage_ptr__->field_0).uint_ = 2;
    goto LAB_001a6656;
  case 6:
    if (data->_M_len < 4) goto LAB_001a66e8;
    pcVar5 = data->_M_str;
    data->_M_str = pcVar5 + 4;
    data->_M_len = data->_M_len - 4;
    (__return_storage_ptr__->field_0).uint_ = 4;
    goto LAB_001a6656;
  case 7:
    if (data->_M_len < 8) goto LAB_001a66e8;
    pcVar5 = data->_M_str;
    data->_M_str = pcVar5 + 8;
    data->_M_len = data->_M_len - 8;
    (__return_storage_ptr__->field_0).uint_ = 8;
    goto LAB_001a6656;
  case 8:
    sVar7 = ReadUntilConsuming(data,'\0');
    break;
  case 9:
  case 0x18:
    sVar7 = ReadVariableBlock(data);
    break;
  case 10:
    sVar7 = ReadBlock<unsigned_char>(data);
    break;
  case 0xb:
    if (data->_M_len == 0) goto LAB_001a66e8;
    pcVar5 = data->_M_str;
    data->_M_str = pcVar5 + 1;
    data->_M_len = data->_M_len - 1;
    (__return_storage_ptr__->field_0).uint_ = 1;
    goto LAB_001a6656;
  case 0xc:
  case 0x11:
    if (data->_M_len == 0) {
LAB_001a66d7:
      Throw("premature EOF reading fixed-length data",0x8d);
    }
    uVar6 = (ulong)(byte)*data->_M_str;
    data->_M_str = data->_M_str + 1;
    sVar3 = data->_M_len - 1;
    goto LAB_001a65aa;
  case 0xd:
  case 0xf:
  case 0x22:
  case 0x23:
    uVar2 = ReadLEB128Internal(false,data);
    goto LAB_001a65ea;
  case 0xe:
    if ((cu->unit_sizes_).dwarf64_ == true) {
      sVar7 = ReadIndirectString<unsigned_long>(cu,data);
    }
    else {
      sVar7 = ReadIndirectString<unsigned_int>(cu,data);
    }
    break;
  case 0x10:
    if (2 < (byte)(cu->unit_sizes_).dwarf_version_) goto switchD_001a62b2_caseD_17;
    goto switchD_001a62b2_caseD_1;
  case 0x12:
    if (data->_M_len < 2) goto LAB_001a66d7;
    uVar6 = (ulong)*(ushort *)data->_M_str;
    data->_M_str = (char *)((long)data->_M_str + 2);
    sVar3 = data->_M_len - 2;
    goto LAB_001a65aa;
  case 0x13:
    if (data->_M_len < 4) goto LAB_001a66d7;
    uVar6 = (ulong)*(uint *)data->_M_str;
    data->_M_str = (char *)((long)data->_M_str + 4);
    sVar3 = data->_M_len - 4;
    goto LAB_001a65aa;
  case 0x14:
  case 0x20:
    if (data->_M_len < 8) goto LAB_001a66d7;
    uVar6 = *(ulong *)data->_M_str;
    data->_M_str = (char *)((long)data->_M_str + 8);
    sVar3 = data->_M_len - 8;
LAB_001a65aa:
    data->_M_len = sVar3;
    (__return_storage_ptr__->field_0).uint_ = uVar6;
LAB_001a65ed:
    __return_storage_ptr__->form_ = form;
    __return_storage_ptr__->type_ = kUint;
    return __return_storage_ptr__;
  case 0x15:
  case 0x25:
    if (data->_M_len == 0) goto LAB_001a66d7;
    uVar6 = (ulong)(byte)*data->_M_str;
    data->_M_str = data->_M_str + 1;
    sVar3 = data->_M_len - 1;
    goto LAB_001a661c;
  case 0x16:
    goto switchD_001a62b2_caseD_16;
  case 0x17:
switchD_001a62b2_caseD_17:
    if ((cu->unit_sizes_).dwarf64_ != true) goto LAB_001a65e0;
    goto LAB_001a65cf;
  case 0x19:
  case 0x21:
    (__return_storage_ptr__->field_0).uint_ = 1;
    goto LAB_001a65ed;
  case 0x1a:
    goto switchD_001a62b2_caseD_1a;
  case 0x1b:
switchD_001a62b2_caseD_1b:
    uVar2 = ReadLEB128Internal(false,data);
    goto LAB_001a656b;
  case 0x1e:
    if (data->_M_len < 0x10) goto LAB_001a66e8;
    pcVar5 = data->_M_str;
    data->_M_str = pcVar5 + 0x10;
    data->_M_len = data->_M_len - 0x10;
    (__return_storage_ptr__->field_0).uint_ = 0x10;
LAB_001a6656:
    (__return_storage_ptr__->field_0).string_._M_str = pcVar5;
    goto LAB_001a667b;
  case 0x1f:
    if ((cu->unit_sizes_).dwarf64_ == true) {
      sVar7 = ReadIndirectLineString<unsigned_long>(cu,data);
    }
    else {
      sVar7 = ReadIndirectLineString<unsigned_int>(cu,data);
    }
    break;
  case 0x26:
    if (data->_M_len < 2) goto LAB_001a66d7;
    uVar6 = (ulong)*(ushort *)data->_M_str;
    data->_M_str = (char *)((long)data->_M_str + 2);
    sVar3 = data->_M_len - 2;
    goto LAB_001a661c;
  case 0x27:
    uVar1 = ReadFixed<unsigned_int,3ul>(data);
    uVar2 = (uint64_t)uVar1;
    goto LAB_001a65bc;
  case 0x28:
    if (data->_M_len < 4) goto LAB_001a66d7;
    uVar6 = (ulong)*(uint *)data->_M_str;
    data->_M_str = (char *)((long)data->_M_str + 4);
    sVar3 = data->_M_len - 4;
LAB_001a661c:
    data->_M_len = sVar3;
    *(ulong *)&__return_storage_ptr__->field_0 = uVar6;
LAB_001a6622:
    __return_storage_ptr__->form_ = form;
    __return_storage_ptr__->type_ = kUnresolvedString;
    return __return_storage_ptr__;
  case 0x29:
    if (data->_M_len == 0) goto LAB_001a66d7;
    uVar6 = (ulong)(byte)*data->_M_str;
    data->_M_str = data->_M_str + 1;
    sVar3 = data->_M_len - 1;
    goto LAB_001a652f;
  case 0x2a:
    if (data->_M_len < 2) goto LAB_001a66d7;
    uVar6 = (ulong)*(ushort *)data->_M_str;
    data->_M_str = (char *)((long)data->_M_str + 2);
    sVar3 = data->_M_len - 2;
    goto LAB_001a652f;
  case 0x2b:
    uVar1 = ReadFixed<unsigned_int,3ul>(data);
    uVar2 = (uint64_t)uVar1;
LAB_001a656b:
    (__return_storage_ptr__->field_0).uint_ = uVar2;
    goto LAB_001a656e;
  case 0x2c:
    if (data->_M_len < 4) goto LAB_001a66d7;
    uVar6 = (ulong)*(uint *)data->_M_str;
    data->_M_str = (char *)((long)data->_M_str + 4);
    sVar3 = data->_M_len - 4;
LAB_001a652f:
    data->_M_len = sVar3;
    *(ulong *)&__return_storage_ptr__->field_0 = uVar6;
LAB_001a656e:
    __return_storage_ptr__->form_ = form;
    __return_storage_ptr__->type_ = kUnresolvedUint;
    return __return_storage_ptr__;
  default:
    if (form == 0x1f01) goto switchD_001a62b2_caseD_1b;
    if (form != 0x1f02) goto switchD_001a62b2_caseD_2;
    goto switchD_001a62b2_caseD_1a;
  }
  (__return_storage_ptr__->field_0).string_ = sVar7;
LAB_001a667b:
  __return_storage_ptr__->form_ = form;
  __return_storage_ptr__->type_ = kString;
  return __return_storage_ptr__;
switchD_001a62b2_caseD_1a:
  uVar2 = ReadLEB128Internal(false,data);
LAB_001a65bc:
  (__return_storage_ptr__->field_0).uint_ = uVar2;
  goto LAB_001a6622;
switchD_001a62b2_caseD_16:
  form = ReadLEB128<unsigned_short>(data);
  if (form == 0x16) {
    Throw("indirect attribute has indirect form type",0x85);
  }
  goto LAB_001a62a0;
switchD_001a62b2_caseD_1:
  if ((cu->unit_sizes_).addr8_ == false) {
LAB_001a65e0:
    uVar1 = ReadFixed<unsigned_int,4ul>(data);
    uVar2 = (uint64_t)uVar1;
  }
  else {
LAB_001a65cf:
    uVar2 = ReadFixed<unsigned_long,8ul>(data);
  }
LAB_001a65ea:
  (__return_storage_ptr__->field_0).uint_ = uVar2;
  goto LAB_001a65ed;
}

Assistant:

AttrValue AttrValue::ParseAttr(const CU& cu, uint16_t form, string_view* data) {
  switch (form) {
    case DW_FORM_indirect: {
      uint16_t indirect_form = ReadLEB128<uint16_t>(data);
      if (indirect_form == DW_FORM_indirect) {
        THROW("indirect attribute has indirect form type");
      }
      return ParseAttr(cu, indirect_form, data);
    }
    case DW_FORM_ref1:
      return AttrValue(form, ReadFixed<uint8_t>(data));
    case DW_FORM_ref2:
      return AttrValue(form, ReadFixed<uint16_t>(data));
    case DW_FORM_ref4:
      return AttrValue(form, ReadFixed<uint32_t>(data));
    case DW_FORM_ref_sig8:
    case DW_FORM_ref8:
      return AttrValue(form, ReadFixed<uint64_t>(data));
    case DW_FORM_ref_udata:
    case DW_FORM_strx1:
      return AttrValue::UnresolvedString(form, ReadFixed<uint8_t>(data));
    case DW_FORM_strx2:
      return AttrValue::UnresolvedString(form, ReadFixed<uint16_t>(data));
    case DW_FORM_strx3:
      return AttrValue::UnresolvedString(form, ReadFixed<uint32_t, 3>(data));
    case DW_FORM_strx4:
      return AttrValue::UnresolvedString(form, ReadFixed<uint32_t>(data));
    case DW_FORM_strx:
    case DW_FORM_GNU_str_index:
      return AttrValue::UnresolvedString(form, ReadLEB128<uint64_t>(data));
    case DW_FORM_addrx1:
      return AttrValue::UnresolvedUint(form, ReadFixed<uint8_t>(data));
    case DW_FORM_addrx2:
      return AttrValue::UnresolvedUint(form, ReadFixed<uint16_t>(data));
    case DW_FORM_addrx3:
      return AttrValue::UnresolvedUint(form, ReadFixed<uint32_t, 3>(data));
    case DW_FORM_addrx4:
      return AttrValue::UnresolvedUint(form, ReadFixed<uint32_t>(data));
    case DW_FORM_addrx:
    case DW_FORM_GNU_addr_index:
      return AttrValue::UnresolvedUint(form, ReadLEB128<uint64_t>(data));
    case DW_FORM_addr:
    address_size:
      switch (cu.unit_sizes().address_size()) {
        case 4:
          return AttrValue(form, ReadFixed<uint32_t>(data));
        case 8:
          return AttrValue(form, ReadFixed<uint64_t>(data));
        default:
          BLOATY_UNREACHABLE();
      }
    case DW_FORM_ref_addr:
      if (cu.unit_sizes().dwarf_version() <= 2) {
        goto address_size;
      }
      ABSL_FALLTHROUGH_INTENDED;
    case DW_FORM_sec_offset:
      if (cu.unit_sizes().dwarf64()) {
        return AttrValue(form, ReadFixed<uint64_t>(data));
      } else {
        return AttrValue(form, ReadFixed<uint32_t>(data));
      }
    case DW_FORM_udata:
      return AttrValue(form, ReadLEB128<uint64_t>(data));
    case DW_FORM_block1:
      return AttrValue(form, ReadBlock<uint8_t>(data));
    case DW_FORM_block2:
      return AttrValue(form, ReadBlock<uint16_t>(data));
    case DW_FORM_block4:
      return AttrValue(form, ReadBlock<uint32_t>(data));
    case DW_FORM_block:
    case DW_FORM_exprloc:
      return AttrValue(form, ReadVariableBlock(data));
    case DW_FORM_string:
      return AttrValue(form, ReadNullTerminated(data));
    case DW_FORM_strp:
      if (cu.unit_sizes().dwarf64()) {
        return AttrValue(form, ReadIndirectString<uint64_t>(cu, data));
      } else {
        return AttrValue(form, ReadIndirectString<uint32_t>(cu, data));
      }
    case DW_FORM_line_strp:
      if (cu.unit_sizes().dwarf64()) {
        return AttrValue(form, ReadIndirectLineString<uint64_t>(cu, data));
      } else {
        return AttrValue(form, ReadIndirectLineString<uint32_t>(cu, data));
      }
    case DW_FORM_data1:
      return AttrValue(form, ReadBytes(1, data));
    case DW_FORM_data2:
      return AttrValue(form, ReadBytes(2, data));
    case DW_FORM_data4:
      return AttrValue(form, ReadBytes(4, data));
    case DW_FORM_data8:
      return AttrValue(form, ReadBytes(8, data));
    case DW_FORM_data16:
      return AttrValue(form, ReadBytes(16, data));
    case DW_FORM_loclistx:
    case DW_FORM_rnglistx:
      return AttrValue(form, ReadLEB128<uint64_t>(data));

    // Bloaty doesn't currently care about any bool or signed data.
    // So we fudge it a bit and just stuff these in a uint64.
    case DW_FORM_flag_present:
      return AttrValue(form, 1);
    case DW_FORM_flag:
      return AttrValue(form, ReadFixed<uint8_t>(data));
    case DW_FORM_sdata:
      return AttrValue(form, ReadLEB128<uint64_t>(data));
    case DW_FORM_implicit_const:
      return AttrValue(form, 1);
    default:
      THROWF("Don't know how to parse DWARF form: $0", form);
  }
}